

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O3

bool embree::sse42::
     BVHNIntersector1<4,_1,_true,_embree::sse42::ArrayIntersector1<embree::sse42::QuadMvIntersector1Pluecker<4,_true>_>_>
     ::pointQuery(Intersectors *This,PointQuery *query,PointQueryContext *context)

{
  float fVar1;
  float fVar2;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar3;
  undefined8 uVar4;
  Geometry *this;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  undefined1 (*pauVar8) [16];
  bool bVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  long lVar15;
  byte bVar16;
  undefined1 (*pauVar17) [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  undefined1 auVar29 [16];
  float fVar30;
  float fVar33;
  float fVar34;
  undefined1 auVar31 [16];
  float fVar35;
  undefined1 auVar32 [16];
  float fVar36;
  float fVar38;
  float fVar39;
  float fVar40;
  undefined1 auVar37 [16];
  float fVar41;
  float fVar46;
  float fVar47;
  float fVar48;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined4 local_101c;
  float local_ff8 [4];
  float local_fe8;
  float fStack_fe4;
  float fStack_fe0;
  float fStack_fdc;
  float local_fd8;
  float fStack_fd4;
  float fStack_fd0;
  float fStack_fcc;
  float local_fc8;
  float fStack_fc4;
  float fStack_fc0;
  float fStack_fbc;
  undefined8 local_fb8;
  float fStack_fb0;
  float fStack_fac;
  ulong local_fa8;
  ulong local_fa0;
  undefined1 local_f98 [16];
  float local_f88;
  float fStack_f84;
  float fStack_f80;
  float fStack_f7c;
  ulong local_f78;
  undefined4 uStack_f70;
  undefined1 local_f68 [3896];
  
  uVar11 = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (uVar11 == 8) {
    return false;
  }
  local_f78 = uVar11;
  uStack_f70 = 0;
  fVar1 = (query->p).field_0.field_0.x;
  fVar2 = (query->p).field_0.field_0.y;
  fVar53 = (query->p).field_0.field_0.z;
  local_fc8 = (context->query_radius).field_0.m128[0];
  fStack_fd4 = *(float *)((long)&(context->query_radius).field_0 + 4);
  fStack_fe4 = *(float *)((long)&(context->query_radius).field_0 + 8);
  if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
    local_f98 = ZEXT416((uint)(query->radius * query->radius));
  }
  else {
    aVar3 = (context->query_radius).field_0;
    local_f98 = dpps((undefined1  [16])aVar3,(undefined1  [16])aVar3,0x7f);
  }
  pauVar17 = (undefined1 (*) [16])local_f68;
  auVar52._4_4_ = fVar1;
  auVar52._0_4_ = fVar1;
  auVar52._8_4_ = fVar1;
  auVar52._12_4_ = fVar1;
  auVar49._4_4_ = fVar2;
  auVar49._0_4_ = fVar2;
  auVar49._8_4_ = fVar2;
  auVar49._12_4_ = fVar2;
  local_fd8 = fStack_fd4;
  fStack_fd0 = fStack_fd4;
  fStack_fcc = fStack_fd4;
  local_fe8 = fStack_fe4;
  fStack_fe0 = fStack_fe4;
  fStack_fdc = fStack_fe4;
  fVar25 = local_fc8 * local_fc8;
  local_101c = 0;
  local_f88 = fVar53;
  fStack_f84 = fVar53;
  fStack_f80 = fVar53;
  fStack_f7c = fVar53;
  fVar26 = fVar25;
  fVar27 = fVar25;
  fVar28 = fVar25;
  fStack_fc4 = local_fc8;
  fStack_fc0 = local_fc8;
  fStack_fbc = local_fc8;
  fVar54 = fVar53;
  fVar55 = fVar53;
  fVar56 = fVar53;
LAB_00d9c031:
  local_fb8 = CONCAT44(fVar1 - fStack_fc4,fVar1 - local_fc8);
  fStack_fb0 = fVar1 - fStack_fc0;
  fStack_fac = fVar1 - fStack_fbc;
  while (pauVar8 = pauVar17 + -1, pauVar17 = pauVar17 + -1,
        *(float *)((long)*pauVar8 + 8) <= local_f98._0_4_) {
    uVar12 = *(ulong *)*pauVar17;
LAB_00d9c086:
    if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
      if ((uVar12 & 8) != 0) {
LAB_00d9c3f5:
        uVar11 = (ulong)((uint)uVar12 & 0xf) - 8;
        local_fa8 = uVar11;
        if (uVar11 == 0) break;
        lVar14 = (uVar12 & 0xfffffffffffffff0) + 0xd0;
        uVar11 = 0;
        uVar12 = 0;
        goto LAB_00d9c424;
      }
      auVar29 = *(undefined1 (*) [16])(uVar12 + 0x20);
      auVar32 = *(undefined1 (*) [16])(uVar12 + 0x30);
      auVar31 = maxps(auVar52,auVar29);
      auVar31 = minps(auVar31,auVar32);
      fVar30 = auVar31._0_4_ - fVar1;
      fVar33 = auVar31._4_4_ - fVar1;
      fVar34 = auVar31._8_4_ - fVar1;
      fVar35 = auVar31._12_4_ - fVar1;
      auVar31 = maxps(auVar49,*(undefined1 (*) [16])(uVar12 + 0x40));
      auVar31 = minps(auVar31,*(undefined1 (*) [16])(uVar12 + 0x50));
      fVar36 = auVar31._0_4_ - fVar2;
      fVar38 = auVar31._4_4_ - fVar2;
      fVar39 = auVar31._8_4_ - fVar2;
      fVar40 = auVar31._12_4_ - fVar2;
      auVar31._4_4_ = fVar54;
      auVar31._0_4_ = fVar53;
      auVar31._8_4_ = fVar55;
      auVar31._12_4_ = fVar56;
      auVar31 = maxps(auVar31,*(undefined1 (*) [16])(uVar12 + 0x60));
      auVar31 = minps(auVar31,*(undefined1 (*) [16])(uVar12 + 0x70));
      fVar41 = auVar31._0_4_ - fVar53;
      fVar46 = auVar31._4_4_ - fVar54;
      fVar47 = auVar31._8_4_ - fVar55;
      fVar48 = auVar31._12_4_ - fVar56;
      local_ff8[0] = fVar41 * fVar41 + fVar36 * fVar36 + fVar30 * fVar30;
      local_ff8[1] = fVar46 * fVar46 + fVar38 * fVar38 + fVar33 * fVar33;
      local_ff8[2] = fVar47 * fVar47 + fVar39 * fVar39 + fVar34 * fVar34;
      local_ff8[3] = fVar48 * fVar48 + fVar40 * fVar40 + fVar35 * fVar35;
      bVar6 = auVar29._0_4_ <= auVar32._0_4_ && local_ff8[0] <= fVar25;
      bVar7 = auVar29._4_4_ <= auVar32._4_4_ && local_ff8[1] <= fVar26;
      bVar5 = auVar29._8_4_ <= auVar32._8_4_ && local_ff8[2] <= fVar27;
      bVar9 = auVar29._12_4_ <= auVar32._12_4_ && local_ff8[3] <= fVar28;
    }
    else {
      if ((uVar12 & 8) != 0) goto LAB_00d9c3f5;
      auVar29 = *(undefined1 (*) [16])(uVar12 + 0x60);
      auVar32 = *(undefined1 (*) [16])(uVar12 + 0x20);
      auVar31 = *(undefined1 (*) [16])(uVar12 + 0x30);
      auVar44 = *(undefined1 (*) [16])(uVar12 + 0x40);
      auVar45 = *(undefined1 (*) [16])(uVar12 + 0x50);
      auVar51 = *(undefined1 (*) [16])(uVar12 + 0x70);
      auVar43 = maxps(auVar52,auVar32);
      auVar43 = minps(auVar43,auVar31);
      fVar30 = auVar43._0_4_ - fVar1;
      fVar34 = auVar43._4_4_ - fVar1;
      fVar36 = auVar43._8_4_ - fVar1;
      fVar39 = auVar43._12_4_ - fVar1;
      auVar43 = maxps(auVar49,auVar44);
      auVar43 = minps(auVar43,auVar45);
      fVar41 = auVar43._0_4_ - fVar2;
      fVar46 = auVar43._4_4_ - fVar2;
      fVar47 = auVar43._8_4_ - fVar2;
      fVar48 = auVar43._12_4_ - fVar2;
      auVar43._4_4_ = fVar54;
      auVar43._0_4_ = fVar53;
      auVar43._8_4_ = fVar55;
      auVar43._12_4_ = fVar56;
      auVar43 = maxps(auVar43,auVar29);
      auVar43 = minps(auVar43,auVar51);
      fVar33 = auVar43._0_4_ - fVar53;
      fVar35 = auVar43._4_4_ - fVar54;
      fVar38 = auVar43._8_4_ - fVar55;
      fVar40 = auVar43._12_4_ - fVar56;
      local_ff8[0] = fVar33 * fVar33 + fVar41 * fVar41 + fVar30 * fVar30;
      local_ff8[1] = fVar35 * fVar35 + fVar46 * fVar46 + fVar34 * fVar34;
      local_ff8[2] = fVar38 * fVar38 + fVar47 * fVar47 + fVar36 * fVar36;
      local_ff8[3] = fVar40 * fVar40 + fVar48 * fVar48 + fVar39 * fVar39;
      bVar6 = ((auVar29._0_4_ <= fVar53 + local_fe8 && fVar1 - local_fc8 <= auVar31._0_4_) &&
              (auVar32._0_4_ <= fVar1 + local_fc8 && auVar44._0_4_ <= fVar2 + local_fd8)) &&
              (fVar53 - local_fe8 <= auVar51._0_4_ &&
              (auVar32._0_4_ <= auVar31._0_4_ && fVar2 - local_fd8 <= auVar45._0_4_));
      bVar7 = ((auVar29._4_4_ <= fVar54 + fStack_fe4 && fVar1 - fStack_fc4 <= auVar31._4_4_) &&
              (auVar32._4_4_ <= fVar1 + fStack_fc4 && auVar44._4_4_ <= fVar2 + fStack_fd4)) &&
              (fVar54 - fStack_fe4 <= auVar51._4_4_ &&
              (auVar32._4_4_ <= auVar31._4_4_ && fVar2 - fStack_fd4 <= auVar45._4_4_));
      bVar5 = ((auVar29._8_4_ <= fVar55 + fStack_fe0 && fVar1 - fStack_fc0 <= auVar31._8_4_) &&
              (auVar32._8_4_ <= fVar1 + fStack_fc0 && auVar44._8_4_ <= fVar2 + fStack_fd0)) &&
              (fVar55 - fStack_fe0 <= auVar51._8_4_ &&
              (auVar32._8_4_ <= auVar31._8_4_ && fVar2 - fStack_fd0 <= auVar45._8_4_));
      bVar9 = ((auVar29._12_4_ <= fVar56 + fStack_fdc && fVar1 - fStack_fbc <= auVar31._12_4_) &&
              (auVar32._12_4_ <= fVar1 + fStack_fbc && auVar44._12_4_ <= fVar2 + fStack_fcc)) &&
              (fVar56 - fStack_fdc <= auVar51._12_4_ &&
              (auVar32._12_4_ <= auVar31._12_4_ && fVar2 - fStack_fcc <= auVar45._12_4_));
    }
    auVar29._0_4_ = (uint)bVar6 * -0x80000000;
    auVar29._4_4_ = (uint)bVar7 * -0x80000000;
    auVar29._8_4_ = (uint)bVar5 * -0x80000000;
    auVar29._12_4_ = (uint)bVar9 * -0x80000000;
    uVar10 = movmskps((int)uVar11,auVar29);
    uVar11 = (ulong)uVar10;
    if (uVar10 != 0) {
      uVar13 = uVar12 & 0xfffffffffffffff0;
      lVar14 = 0;
      if ((byte)uVar10 != 0) {
        for (; ((byte)uVar10 >> lVar14 & 1) == 0; lVar14 = lVar14 + 1) {
        }
      }
      uVar11 = *(ulong *)(uVar13 + lVar14 * 8);
      uVar10 = (uVar10 & 0xff) - 1 & uVar10 & 0xff;
      uVar12 = uVar11;
      if (uVar10 != 0) {
        fVar30 = local_ff8[lVar14];
        lVar14 = 0;
        if (uVar10 != 0) {
          for (; (uVar10 >> lVar14 & 1) == 0; lVar14 = lVar14 + 1) {
          }
        }
        uVar12 = *(ulong *)(uVar13 + lVar14 * 8);
        fVar33 = local_ff8[lVar14];
        uVar10 = uVar10 - 1 & uVar10;
        if (uVar10 == 0) {
          if ((uint)fVar30 < (uint)fVar33) {
            *(ulong *)*pauVar17 = uVar12;
            *(float *)((long)*pauVar17 + 8) = fVar33;
            uVar12 = uVar11;
            pauVar17 = pauVar17 + 1;
          }
          else {
            *(ulong *)*pauVar17 = uVar11;
            *(float *)((long)*pauVar17 + 8) = fVar30;
            uVar11 = uVar12;
            pauVar17 = pauVar17 + 1;
          }
        }
        else {
          auVar32._8_4_ = fVar30;
          auVar32._0_8_ = uVar11;
          auVar32._12_4_ = 0;
          auVar44._8_4_ = fVar33;
          auVar44._0_8_ = uVar12;
          auVar44._12_4_ = 0;
          lVar14 = 0;
          if (uVar10 != 0) {
            for (; (uVar10 >> lVar14 & 1) == 0; lVar14 = lVar14 + 1) {
            }
          }
          uVar4 = *(undefined8 *)(uVar13 + lVar14 * 8);
          fVar34 = local_ff8[lVar14];
          auVar51._8_4_ = fVar34;
          auVar51._0_8_ = uVar4;
          auVar51._12_4_ = 0;
          auVar45._8_4_ = -(uint)((int)fVar30 < (int)fVar33);
          uVar10 = uVar10 - 1 & uVar10;
          if (uVar10 == 0) {
            auVar45._4_4_ = auVar45._8_4_;
            auVar45._0_4_ = auVar45._8_4_;
            auVar45._12_4_ = auVar45._8_4_;
            auVar42._8_4_ = fVar33;
            auVar42._0_8_ = uVar12;
            auVar42._12_4_ = 0;
            auVar43 = blendvps(auVar42,auVar32,auVar45);
            auVar29 = blendvps(auVar32,auVar44,auVar45);
            auVar18._8_4_ = -(uint)(auVar43._8_4_ < (int)fVar34);
            auVar18._4_4_ = auVar18._8_4_;
            auVar18._0_4_ = auVar18._8_4_;
            auVar18._12_4_ = auVar18._8_4_;
            auVar37._8_4_ = fVar34;
            auVar37._0_8_ = uVar4;
            auVar37._12_4_ = 0;
            auVar31 = blendvps(auVar37,auVar43,auVar18);
            auVar44 = blendvps(auVar43,auVar51,auVar18);
            auVar19._8_4_ = -(uint)(auVar29._8_4_ < auVar44._8_4_);
            auVar19._4_4_ = auVar19._8_4_;
            auVar19._0_4_ = auVar19._8_4_;
            auVar19._12_4_ = auVar19._8_4_;
            auVar32 = blendvps(auVar44,auVar29,auVar19);
            auVar29 = blendvps(auVar29,auVar44,auVar19);
            *pauVar17 = auVar29;
            pauVar17[1] = auVar32;
            uVar11 = auVar31._0_8_;
            pauVar17 = pauVar17 + 2;
            uVar12 = uVar11;
          }
          else {
            lVar14 = 0;
            if (uVar10 != 0) {
              for (; (uVar10 >> lVar14 & 1) == 0; lVar14 = lVar14 + 1) {
              }
            }
            auVar20._4_4_ = auVar45._8_4_;
            auVar20._0_4_ = auVar45._8_4_;
            auVar20._8_4_ = auVar45._8_4_;
            auVar20._12_4_ = auVar45._8_4_;
            auVar45 = blendvps(auVar44,auVar32,auVar20);
            auVar29 = blendvps(auVar32,auVar44,auVar20);
            auVar50._8_4_ = local_ff8[lVar14];
            auVar50._0_8_ = *(undefined8 *)(uVar13 + lVar14 * 8);
            auVar50._12_4_ = 0;
            auVar21._8_4_ = -(uint)((int)fVar34 < (int)local_ff8[lVar14]);
            auVar21._4_4_ = auVar21._8_4_;
            auVar21._0_4_ = auVar21._8_4_;
            auVar21._12_4_ = auVar21._8_4_;
            auVar31 = blendvps(auVar50,auVar51,auVar21);
            auVar32 = blendvps(auVar51,auVar50,auVar21);
            auVar22._8_4_ = -(uint)(auVar29._8_4_ < auVar32._8_4_);
            auVar22._4_4_ = auVar22._8_4_;
            auVar22._0_4_ = auVar22._8_4_;
            auVar22._12_4_ = auVar22._8_4_;
            auVar51 = blendvps(auVar32,auVar29,auVar22);
            auVar29 = blendvps(auVar29,auVar32,auVar22);
            auVar23._8_4_ = -(uint)(auVar45._8_4_ < auVar31._8_4_);
            auVar23._4_4_ = auVar23._8_4_;
            auVar23._0_4_ = auVar23._8_4_;
            auVar23._12_4_ = auVar23._8_4_;
            auVar32 = blendvps(auVar31,auVar45,auVar23);
            auVar44 = blendvps(auVar45,auVar31,auVar23);
            auVar24._8_4_ = -(uint)(auVar44._8_4_ < auVar51._8_4_);
            auVar24._4_4_ = auVar24._8_4_;
            auVar24._0_4_ = auVar24._8_4_;
            auVar24._12_4_ = auVar24._8_4_;
            auVar31 = blendvps(auVar51,auVar44,auVar24);
            auVar44 = blendvps(auVar44,auVar51,auVar24);
            *pauVar17 = auVar29;
            pauVar17[1] = auVar44;
            pauVar17[2] = auVar31;
            uVar11 = auVar32._0_8_;
            pauVar17 = pauVar17 + 3;
            uVar12 = uVar11;
          }
        }
      }
      goto LAB_00d9c086;
    }
    if (pauVar17 == (undefined1 (*) [16])&local_f78) {
      return local_101c._0_1_;
    }
  }
  goto LAB_00d9c532;
LAB_00d9c424:
  do {
    local_fa0 = uVar12;
    lVar15 = -4;
    bVar16 = 0;
    local_fb8 = uVar11;
    do {
      uVar10 = *(uint *)(lVar14 + lVar15 * 4);
      if ((ulong)uVar10 == 0xffffffff) break;
      this = (context->scene->geometries).items[uVar10].ptr;
      context->geomID = uVar10;
      context->primID = *(uint *)(lVar14 + 0x10 + lVar15 * 4);
      bVar9 = Geometry::pointQuery(this,query,context);
      bVar16 = bVar16 | bVar9;
      lVar15 = lVar15 + 1;
      fVar53 = local_f88;
      fVar54 = fStack_f84;
      fVar55 = fStack_f80;
      fVar56 = fStack_f7c;
    } while (lVar15 != 0);
    uVar12 = CONCAT71((int7)(local_fa0 >> 8),(byte)local_fa0 | bVar16);
    uVar11 = local_fb8 + 1;
    lVar14 = lVar14 + 0xe0;
  } while (uVar11 != local_fa8);
  if ((local_fa0 & 1) != 0 || bVar16 != 0) {
    auVar29 = *(undefined1 (*) [16])(context->query_radius).field_0.m128;
    local_fc8 = auVar29._0_4_;
    fStack_fd4 = auVar29._4_4_;
    fStack_fe4 = auVar29._8_4_;
    local_fd8 = fStack_fd4;
    fStack_fd0 = fStack_fd4;
    fStack_fcc = fStack_fd4;
    local_fe8 = fStack_fe4;
    fStack_fe0 = fStack_fe4;
    fStack_fdc = fStack_fe4;
    if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
      local_f98 = ZEXT416((uint)(query->radius * query->radius));
    }
    else {
      local_f98 = dpps(auVar29,auVar29,0x7f);
    }
    uVar11 = CONCAT71((int7)(uVar11 >> 8),1);
    local_101c = (undefined4)uVar11;
    fStack_fc4 = local_fc8;
    fStack_fc0 = local_fc8;
    fStack_fbc = local_fc8;
  }
LAB_00d9c532:
  fVar25 = local_fc8 * local_fc8;
  fVar26 = fStack_fc4 * fStack_fc4;
  fVar27 = fStack_fc0 * fStack_fc0;
  fVar28 = fStack_fbc * fStack_fbc;
  if (pauVar17 == (undefined1 (*) [16])&local_f78) {
    return local_101c._0_1_;
  }
  goto LAB_00d9c031;
}

Assistant:

static __forceinline bool pointQuery(const Accel::Intersectors* This, PointQuery* query, PointQueryContext* context)
      {
        const BVH* __restrict__ bvh = (const BVH*)This->ptr;
        
        /* we may traverse an empty BVH in case all geometry was invalid */
        if (bvh->root == BVH::emptyNode)
          return false;
        
        /* stack state */
        StackItemT<NodeRef> stack[stackSize];    // stack of nodes
        StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
        StackItemT<NodeRef>* stackEnd = stack+stackSize;
        stack[0].ptr  = bvh->root;
        stack[0].dist = neg_inf;
        
        /* verify correct input */
        assert(!(types & BVH_MB) || (query->time >= 0.0f && query->time <= 1.0f));

        /* load the point query into SIMD registers */
        TravPointQuery<N> tquery(query->p, context->query_radius);

        /* initialize the node traverser */
        BVHNNodeTraverser1Hit<N,types> nodeTraverser;

        bool changed = false;
        float cull_radius = context->query_type == POINT_QUERY_TYPE_SPHERE
                          ? query->radius * query->radius
                          : dot(context->query_radius, context->query_radius);

        /* pop loop */
        while (true) pop:
        {
          /* pop next node */
          if (unlikely(stackPtr == stack)) break;
          stackPtr--;
          NodeRef cur = NodeRef(stackPtr->ptr);

          /* if popped node is too far, pop next one */
          if (unlikely(*(float*)&stackPtr->dist > cull_radius))
            continue;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(point_query.trav_nodes,1,1,1);
            bool nodeIntersected;
            if (likely(context->query_type == POINT_QUERY_TYPE_SPHERE)) {
              nodeIntersected = BVHNNodePointQuerySphere1<N, types>::pointQuery(cur, tquery, query->time, tNear, mask);
            } else {
              nodeIntersected = BVHNNodePointQueryAABB1  <N, types>::pointQuery(cur, tquery, query->time, tNear, mask);
            }
            if (unlikely(!nodeIntersected)) { STAT3(point_query.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(point_query.trav_leaves,1,1,1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
          size_t lazy_node = 0;
          if (PrimitiveIntersector1::pointQuery(This, query, context, prim, num, tquery, lazy_node))
          {
            changed = true;
            tquery.rad = context->query_radius;
            cull_radius = context->query_type == POINT_QUERY_TYPE_SPHERE
                        ? query->radius * query->radius
                        : dot(context->query_radius, context->query_radius);
          }

          /* push lazy node onto stack */
          if (unlikely(lazy_node)) {
            stackPtr->ptr = lazy_node;
            stackPtr->dist = neg_inf;
            stackPtr++;
          }
        }
        return changed;
      }